

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kiss_fft.c
# Opt level: O0

int kf_factor(int n,opus_int16 *facbuf)

{
  opus_int16 oVar1;
  int tmp;
  int nbak;
  int stages;
  int i;
  int p;
  opus_int16 *facbuf_local;
  int n_local;
  
  stages = 4;
  tmp = 0;
  facbuf_local._0_4_ = n;
  while( true ) {
    while ((int)facbuf_local % stages != 0) {
      if (stages == 2) {
        stages = 3;
      }
      else if (stages == 4) {
        stages = 2;
      }
      else {
        stages = stages + 2;
      }
      if ((32000 < stages) || ((int)facbuf_local < stages * stages)) {
        stages = (int)facbuf_local;
      }
    }
    facbuf_local._0_4_ = (int)facbuf_local / stages;
    if (5 < stages) break;
    facbuf[tmp << 1] = (opus_int16)stages;
    if ((stages == 2) && (1 < tmp)) {
      facbuf[tmp << 1] = 4;
      facbuf[2] = 2;
    }
    tmp = tmp + 1;
    if ((int)facbuf_local < 2) {
      for (nbak = 0; nbak < tmp / 2; nbak = nbak + 1) {
        oVar1 = facbuf[nbak << 1];
        facbuf[nbak << 1] = facbuf[((tmp - nbak) + -1) * 2];
        facbuf[((tmp - nbak) + -1) * 2] = oVar1;
      }
      facbuf_local._0_4_ = n;
      for (nbak = 0; nbak < tmp; nbak = nbak + 1) {
        facbuf_local._0_4_ = (int)facbuf_local / (int)facbuf[nbak << 1];
        facbuf[nbak * 2 + 1] = (opus_int16)(int)facbuf_local;
      }
      return 1;
    }
  }
  return 0;
}

Assistant:

static
int kf_factor(int n, opus_int16 *facbuf) {
    int p = 4;
    int i;
    int stages = 0;
    int nbak = n;

    /*factor out powers of 4, powers of 2, then any remaining primes */
    do {
        while (n % p) {
            switch (p) {
                case 4:
                    p = 2;
                    break;
                case 2:
                    p = 3;
                    break;
                default:
                    p += 2;
                    break;
            }
            if (p > 32000 || (opus_int32) p * (opus_int32) p > n)
                p = n;          /* no more factors, skip to end */
        }
        n /= p;
#ifdef RADIX_TWO_ONLY
        if (p!=2 && p != 4)
#else
        if (p > 5)
#endif
        {
            return 0;
        }
        facbuf[2 * stages] = p;
        if (p == 2 && stages > 1) {
            facbuf[2 * stages] = 4;
            facbuf[2] = 2;
        }
        stages++;
    } while (n > 1);
    n = nbak;
    /* Reverse the order to get the radix 4 at the end, so we can use the
       fast degenerate case. It turns out that reversing the order also
       improves the noise behaviour. */
    for (i = 0; i < stages / 2; i++) {
        int tmp;
        tmp = facbuf[2 * i];
        facbuf[2 * i] = facbuf[2 * (stages - i - 1)];
        facbuf[2 * (stages - i - 1)] = tmp;
    }
    for (i = 0; i < stages; i++) {
        n /= facbuf[2 * i];
        facbuf[2 * i + 1] = n;
    }
    return 1;
}